

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O0

size_t __thiscall StressTester::GetRandomSize(StressTester *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  int i;
  StressTester *this_local;
  
  iVar3 = PAL_rand();
  switch(iVar3 % 5) {
  case 0:
    this_local = (StressTester *)0x0;
    break;
  case 1:
    iVar3 = PAL_rand();
    this_local = (StressTester *)(long)(iVar3 % 0x10);
    break;
  case 2:
    iVar3 = PAL_rand();
    this_local = (StressTester *)(long)(iVar3 % 0x1000);
    break;
  case 3:
    iVar3 = PAL_rand();
    this_local = (StressTester *)(long)(iVar3 % 0x4000);
    break;
  case 4:
    iVar3 = PAL_rand();
    this_local = (StressTester *)(long)iVar3;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/StressTest.cpp"
                       ,0xba,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    this_local = (StressTester *)0x0;
  }
  return (size_t)this_local;
}

Assistant:

size_t StressTester::GetRandomSize()
{
    int i = rand() % 5;
    switch (i)
    {
    case 0: return 0;
    case 1: return rand() % 16;
    case 2: return rand() % 4096;
    case 3: return rand() % 16384;
    case 4: return rand();
    default:
        Assert(false);
        return 0;
    }
}